

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ExpressionSyntax *args_2;
  AssignmentPatternItemSyntax *pAVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  BumpAllocator *in_stack_ffffffffffffffc8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x27b1f6);
  args_2 = deepClone<slang::syntax::ExpressionSyntax>
                     ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x27b233);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffc8);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AssignmentPatternItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     (this,(ExpressionSyntax *)TVar2.info,TVar2._0_8_,args_2);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AssignmentPatternItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AssignmentPatternItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.key, alloc),
        node.colon.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc)
    );
}